

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

uint FillFlags(uint flags)

{
  long lVar1;
  uint in_EDI;
  long in_FS_OFFSET;
  undefined4 in_stack_0000000c;
  char *in_stack_00000010;
  int in_stack_0000001c;
  char *in_stack_00000020;
  bool *in_stack_00000028;
  uint in_stack_ffffffffffffffe8;
  undefined4 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_EDI;
  if ((in_EDI & 0x100) != 0) {
    local_10 = in_EDI | 0x800;
  }
  if ((local_10 & 0x800) != 0) {
    local_10 = local_10 | 1;
  }
  IsValidFlagCombination(in_stack_ffffffffffffffe8);
  inline_assertion_check<true,bool>
            (in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010,
             (char *)CONCAT44(in_stack_0000000c,flags));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int FillFlags(unsigned int flags)
{
    // CLEANSTACK implies WITNESS
    if (flags & SCRIPT_VERIFY_CLEANSTACK) flags |= SCRIPT_VERIFY_WITNESS;

    // WITNESS implies P2SH (and transitively CLEANSTACK implies P2SH)
    if (flags & SCRIPT_VERIFY_WITNESS) flags |= SCRIPT_VERIFY_P2SH;
    Assert(IsValidFlagCombination(flags));
    return flags;
}